

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_write_data(mtar_t *tar,void *data,size_t size)

{
  size_t *psVar1;
  int iVar2;
  ulong in_RAX;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar2 = (*tar->write)(tar,data,size);
  sVar4 = tar->pos + size;
  tar->pos = sVar4;
  if (iVar2 == 0) {
    psVar1 = &tar->remaining_data;
    *psVar1 = *psVar1 - size;
    iVar2 = 0;
    if (*psVar1 == 0) {
      uStack_28 = uStack_28 & 0xffffffffffffff;
      uVar3 = -(int)sVar4 & 0x1ff;
      uVar5 = (ulong)uVar3;
      iVar2 = 0;
      if (uVar3 != 0) {
        do {
          iVar2 = (*tar->write)(tar,(void *)((long)&uStack_28 + 7),1);
          tar->pos = tar->pos + 1;
          if (iVar2 != 0) {
            return iVar2;
          }
          uVar5 = uVar5 - 1;
          iVar2 = 0;
        } while (uVar5 != 0);
      }
    }
  }
  return iVar2;
}

Assistant:

int mtar_write_data(mtar_t *tar, const void *data, size_t size) {
  int err;
  /* Write data */
  err = mtar_twrite(tar, data, size);
  if (err) {
    return err;
  }
  tar->remaining_data -= size;
  /* Write padding if we've written all the data for this file */
  if (tar->remaining_data == 0) {
    return mtar_write_null_bytes(tar, mtar_round_up(tar->pos, 512) - tar->pos);
  }
  return MTAR_ESUCCESS;
}